

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O1

bool __thiscall
axl::sl::
HashTable<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)(),_axl::sl::HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_axl::sl::EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&,_void_(*)()>
::setBucketCount(HashTable<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)(),_axl::sl::HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_axl::sl::EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&,_void_(*)()>
                 *this,size_t bucketCount)

{
  size_t *psVar1;
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
  *this_00;
  size_t sVar2;
  size_t sVar3;
  HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()> *pHVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  ulong uVar9;
  AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>
  *pAVar10;
  ListLink *extraout_RDX;
  byte *pbVar11;
  ListLink *src;
  size_t sVar12;
  AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>
  *pAVar13;
  byte *pbVar14;
  AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>
  *pAVar15;
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
  newTable;
  ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
  local_58;
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
  *local_38;
  HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()> *pHVar8;
  
  local_58.m_p = (AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>
                  *)0x0;
  local_58.m_hdr = (Hdr *)0x0;
  local_58.m_count = 0;
  bVar5 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>>>
          ::
          setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>>::Construct>
                    ((Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>>>
                      *)&local_58,bucketCount);
  if (bVar5) {
    this_00 = &this->m_table;
    bVar6 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
            ::ensureExclusive(this_00);
    if (bVar6) {
      pAVar15 = (this_00->
                super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
                ).m_p;
    }
    else {
      pAVar15 = (AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>
                 *)0x0;
    }
    bVar6 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
            ::ensureExclusive((Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
                               *)&local_58);
    pAVar13 = local_58.m_p;
    if (!bVar6) {
      pAVar13 = (AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>
                 *)0x0;
    }
    sVar2 = (this->m_table).
            super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
            .m_count;
    src = extraout_RDX;
    local_38 = this_00;
    if (sVar2 != 0) {
      sVar12 = 0;
      do {
        pHVar8 = pAVar15[sVar12].
                 super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>
                 .
                 super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>
                 .m_head;
        if (pHVar8 != (HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
                       *)0x0) {
          do {
            iVar7 = ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>
                    ::remove(&pAVar15[sVar12].
                              super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>
                             ,(char *)pHVar8);
            pHVar8 = (HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
                      *)CONCAT44(extraout_var,iVar7);
            sVar3 = (pHVar8->
                    super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
                    ).m_key.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length;
            if ((long)sVar3 < 1) {
              uVar9 = 0x1505;
            }
            else {
              pbVar14 = (byte *)(pHVar8->
                                super_MapEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
                                ).m_key.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
                                .m_p;
              pbVar11 = pbVar14 + sVar3;
              uVar9 = 0x1505;
              do {
                uVar9 = (ulong)*pbVar14 + uVar9 * 0x21;
                pbVar14 = pbVar14 + 1;
              } while (pbVar14 < pbVar11);
            }
            pAVar10 = pAVar13 + uVar9 % bucketCount;
            pHVar8->m_bucket = pAVar10;
            pHVar4 = (pAVar10->
                     super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>
                     ).
                     super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>
                     .m_tail;
            src = &pHVar4->m_bucketLink;
            if (pHVar4 == (HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
                           *)0x0) {
              src = (ListLink *)0x0;
            }
            (pHVar8->m_bucketLink).m_next = (ListLink *)0x0;
            (pHVar8->m_bucketLink).m_prev = src;
            if (pHVar4 == (HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
                           *)0x0) {
              (pAVar10->
              super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>
              ).
              super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>
              .m_head = pHVar8;
            }
            else {
              src->m_next = &pHVar8->m_bucketLink;
            }
            (pAVar10->
            super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>
            ).
            super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>
            .m_tail = pHVar8;
            psVar1 = &(pAVar10->
                      super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>
                      ).
                      super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>
                      .m_count;
            *psVar1 = *psVar1 + 1;
            pHVar8 = pAVar15[sVar12].
                     super_ListBase<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>
                     .
                     super_ListData<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>_>
                     .m_head;
          } while (pHVar8 != (HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>
                              *)0x0);
        }
        sVar12 = sVar12 + 1;
      } while (sVar12 != sVar2);
    }
    Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
    ::copy(local_38,(EVP_PKEY_CTX *)&local_58,(EVP_PKEY_CTX *)src);
  }
  ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
  ::release(&local_58);
  return bVar5;
}

Assistant:

bool
	setBucketCount(size_t bucketCount) {
		Array<Bucket> newTable;
		bool result = newTable.setCount(bucketCount);
		if (!result)
			return false;

		typename Array<Bucket>::Rwi oldRwi = m_table;
		typename Array<Bucket>::Rwi newRwi = newTable;
		size_t oldBucketCount = m_table.getCount();
		for (size_t i = 0; i < oldBucketCount; i++) {
			Bucket* oldBucket = &oldRwi[i];
			while (!oldBucket->isEmpty()) {
				Entry* entry = oldBucket->removeHead();
				size_t hash = m_hash(entry->m_key);

				Bucket* newBucket = &newRwi[hash % bucketCount];
				entry->m_bucket = newBucket;
				newBucket->insertTail(entry);
			}
		}

		m_table = newTable;
		return true;
	}